

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O2

int gmath::anon_unknown_22::averageAngleAxisOpt(int n,double *x,int m,double *fvec,void *up)

{
  SMatrix<double,_3,_3> *a;
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  Vector3d tmp;
  Matrix33d Ra;
  Matrix33d R;
  SVector<double,_3> SStack_128;
  SMatrix<double,_3,_3> local_110;
  SMatrix<double,_3,_3> local_c8;
  gmath local_78 [72];
  
  SVector<double,_3>::SVector(&SStack_128);
  local_c8.v[0][2] = x[2];
  local_c8.v[0][0] = *x;
  local_c8.v[0][1] = x[1];
  createR((Matrix33d *)local_78,(Vector3d *)&local_c8);
  transpose<double,3,3>(&local_110,local_78,a);
  uVar1 = 0;
  uVar2 = (ulong)(uint)m;
  if (m < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    createR((Matrix33d *)local_78,(Vector3d *)up);
    operator*(&local_c8,&local_110,(SMatrix<double,_3,_3> *)local_78);
    dVar3 = recoverAngleAxis(&local_c8,&SStack_128);
    fvec[uVar1] = dVar3;
    up = (void *)((long)up + 0x18);
  }
  return 0;
}

Assistant:

int averageAngleAxisOpt(int n, double x[], int m, double fvec[], void *up)
{
  Vector3d *v=reinterpret_cast<Vector3d *>(up);
  Vector3d tmp;

  Matrix33d Ra=transpose(createR(Vector3d(x[0], x[1], x[2])));

  for (int i=0; i<m; i++)
  {
    Matrix33d R=createR(v[i]);
    fvec[i]=recoverAngleAxis(Ra*R, tmp);
  }

  return 0;
}